

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse::MergeFrom
          (CodeGeneratorResponse *this,CodeGeneratorResponse *from)

{
  uint uVar1;
  CodeGeneratorResponse *pCVar2;
  LogMessage *other;
  uint32_t *puVar3;
  Arena *pAVar4;
  LogFinisher local_75;
  uint32_t cached_has_bits;
  byte local_61;
  LogMessage local_60;
  CodeGeneratorResponse *local_28;
  CodeGeneratorResponse *from_local;
  CodeGeneratorResponse *this_local;
  CodeGeneratorResponse *local_10;
  
  local_61 = 0;
  local_28 = from;
  from_local = this;
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/plugin.pb.cc"
               ,0x5eb);
    local_61 = 1;
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_75,other);
  }
  if ((local_61 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_60);
  }
  RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File>::MergeFrom
            (&this->file_,&local_28->file_);
  puVar3 = internal::HasBits<1UL>::operator[](&local_28->_has_bits_,0);
  uVar1 = *puVar3;
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      this_local = (CodeGeneratorResponse *)_internal_error_abi_cxx11_(local_28);
      local_10 = this;
      puVar3 = internal::HasBits<1UL>::operator[](&this->_has_bits_,0);
      pCVar2 = this_local;
      *puVar3 = *puVar3 | 1;
      pAVar4 = MessageLite::GetArenaForAllocation((MessageLite *)this);
      internal::ArenaStringPtr::Set(&this->error_,pCVar2,pAVar4);
    }
    if ((uVar1 & 2) != 0) {
      this->supported_features_ = local_28->supported_features_;
    }
    puVar3 = internal::HasBits<1UL>::operator[](&this->_has_bits_,0);
    *puVar3 = uVar1 | *puVar3;
  }
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_,
             &(local_28->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

void CodeGeneratorResponse::MergeFrom(const CodeGeneratorResponse& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.compiler.CodeGeneratorResponse)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  file_.MergeFrom(from.file_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_error(from._internal_error());
    }
    if (cached_has_bits & 0x00000002u) {
      supported_features_ = from.supported_features_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
}